

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

PatternPtr __thiscall trieste::detail::Inside<2UL>::custom_rep(Inside<2UL> *this)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *peVar2;
  undefined **in_RDX;
  long in_RSI;
  PatternPtr PVar3;
  
  if (*(long *)(in_RSI + 8) == 0) {
    peVar2 = (element_type *)operator_new(0x38);
    (peVar2->continuation).
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x100000001;
    peVar2->_vptr_PatternDef = (_func_int **)&PTR___Sp_counted_ptr_inplace_002d4c38;
    peVar2[1]._vptr_PatternDef = (_func_int **)0x0;
    peVar2[1].continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    in_RDX = &PTR__PatternDef_002d4c88;
    (peVar2->continuation).
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__PatternDef_002d4c88;
    pp_Var1 = *(_func_int ***)(in_RSI + 0x20);
    peVar2[1].continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x18);
    peVar2[2]._vptr_PatternDef = pp_Var1;
    (this->super_PatternDef)._vptr_PatternDef =
         (_func_int **)
         &(peVar2->continuation).
          super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    (this->super_PatternDef).continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  }
  else {
    (this->super_PatternDef)._vptr_PatternDef = (_func_int **)0x0;
    (this->super_PatternDef).continuation.
    super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  PVar3.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  PVar3.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_PatternDef;
  return (PatternPtr)
         PVar3.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PatternPtr custom_rep() override
      {
        // Rep(Inside) -> InsideStar
        if (no_continuation())
          return std::make_shared<InsideStar<N>>(types);
        return {};
      }